

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::UnmapTextureSubresource
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,ITexture *pTexture,Uint32 MipLevel,
          Uint32 ArraySlice)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar2;
  uint uVar3;
  string msg;
  string local_40;
  
  if (pTexture == (ITexture *)0x0) {
    FormatString<char[26]>(&local_40,(char (*) [26])0x754aa1);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"UnmapTextureSubresource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x75f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  iVar1 = (*(pTexture->super_IDeviceObject).super_IObject._vptr_IObject[4])(pTexture);
  if (*(uint *)(CONCAT44(extraout_var,iVar1) + 0x1c) <= MipLevel) {
    FormatString<char[26]>(&local_40,(char (*) [26])"Mip level is out of range");
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"UnmapTextureSubresource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x760);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  iVar1 = (*(pTexture->super_IDeviceObject).super_IObject._vptr_IObject[4])(pTexture);
  uVar2 = 1;
  uVar3 = (uint)*(byte *)(CONCAT44(extraout_var_00,iVar1) + 8);
  if ((uVar3 < 9) && ((0x1a8U >> (uVar3 & 0x1f) & 1) != 0)) {
    uVar2 = *(uint *)(CONCAT44(extraout_var_00,iVar1) + 0x14);
  }
  if (uVar2 <= ArraySlice) {
    FormatString<char[28]>(&local_40,(char (*) [28])"Array slice is out of range");
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"UnmapTextureSubresource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x761);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::UnmapTextureSubresource(
    ITexture* pTexture,
    Uint32    MipLevel,
    Uint32    ArraySlice)
{
    DEV_CHECK_ERR(pTexture, "pTexture must not be null");
    DEV_CHECK_ERR(MipLevel < pTexture->GetDesc().MipLevels, "Mip level is out of range");
    DEV_CHECK_ERR(ArraySlice < pTexture->GetDesc().GetArraySize(), "Array slice is out of range");
}